

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

void Abc_NtkPartitionPrint(Abc_Ntk_t *pNtk,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  uint local_34;
  int Counter;
  int nOutputs;
  int i;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vPartSuppsAll_local;
  Vec_Ptr_t *vPartsAll_local;
  Abc_Ntk_t *pNtk_local;
  
  local_34 = 0;
  for (Counter = 0; iVar1 = Vec_PtrSize(vPartSuppsAll), Counter < iVar1; Counter = Counter + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,Counter);
    p_00 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,Counter);
    uVar3 = Vec_IntSize(p_00);
    uVar2 = Vec_IntSize(p);
    printf("%d=(%d,%d) ",(ulong)(uint)Counter,(ulong)uVar2,(ulong)uVar3);
    local_34 = uVar3 + local_34;
    iVar1 = Vec_PtrSize(vPartsAll);
    if (Counter == iVar1 + -1) break;
  }
  uVar3 = Abc_NtkCoNum(pNtk);
  printf("\nTotal = %d. Outputs = %d.\n",(ulong)local_34,(ulong)uVar3);
  return;
}

Assistant:

void Abc_NtkPartitionPrint( Abc_Ntk_t * pNtk, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll )
{
    Vec_Int_t * vOne;
    int i, nOutputs, Counter;

    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        nOutputs = Vec_IntSize((Vec_Int_t *)Vec_PtrEntry(vPartsAll, i));
        printf( "%d=(%d,%d) ", i, Vec_IntSize(vOne), nOutputs );
        Counter += nOutputs;
        if ( i == Vec_PtrSize(vPartsAll) - 1 )
            break;
    }
//    assert( Counter == Abc_NtkCoNum(pNtk) );
    printf( "\nTotal = %d. Outputs = %d.\n", Counter, Abc_NtkCoNum(pNtk) );
}